

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  FILE *__stream;
  long in_FS_OFFSET;
  stringstream stream;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_1a0);
  PrintXmlTestsList(local_190,test_cases);
  StringStreamToString(&local_1c0,(stringstream *)local_1a0);
  fputs(local_1c0._M_dataplus._M_p,__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestCase*>& test_cases) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_cases);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}